

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

void __thiscall
FIX::DataDictionary::addXMLGroup
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool groupRequired)

{
  DOMNode *pDVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int field;
  ConfigError *this_00;
  int field_00;
  DataDictionary *pDoc_00;
  DOMDocument *pDVar7;
  undefined7 in_register_00000089;
  int delim;
  allocator<char> local_4b1;
  DOMNode *local_4b0;
  long *local_4a8;
  string *local_4a0;
  undefined4 local_494;
  string required;
  long *local_460;
  DataDictionary *local_458;
  string name;
  string local_430 [32];
  DataDictionary groupDD;
  
  local_494 = (undefined4)CONCAT71(in_register_00000089,groupRequired);
  local_4a0 = msgtype;
  (*pNode->_vptr_DOMNode[4])(&local_460,pNode);
  plVar2 = local_460;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&groupDD,"name",(allocator<char> *)&required);
  pDoc_00 = &groupDD;
  cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,pDoc_00,&name);
  std::__cxx11::string::~string((string *)&groupDD);
  if (cVar4 == '\0') {
    this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&groupDD,"No name given to group",(allocator<char> *)&required);
    ConfigError::ConfigError(this_00,(string *)&groupDD);
    __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
  }
  field = lookupXMLFieldNumber(this,(DOMDocument *)pDoc_00,&name);
  DataDictionary(&groupDD);
  local_458 = DD;
  (*pNode->_vptr_DOMNode[2])(&local_4b0,pNode);
  delim = 0;
  field_00 = 0;
  do {
    if (local_4b0 == (DOMNode *)0x0) {
      if (delim != 0) {
        addGroup(local_458,local_4a0,field,delim,&groupDD);
        if (local_4b0 != (DOMNode *)0x0) {
          (*local_4b0->_vptr_DOMNode[1])();
        }
      }
      ~DataDictionary(&groupDD);
      std::__cxx11::string::~string((string *)&name);
      if (local_460 != (long *)0x0) {
        (**(code **)(*local_460 + 8))();
      }
      return;
    }
    (*local_4b0->_vptr_DOMNode[5])(&required);
    pDVar7 = (DOMDocument *)0x1ca3aa;
    bVar5 = std::operator==(&required,"field");
    std::__cxx11::string::~string((string *)&required);
    if (bVar5) {
      field_00 = lookupXMLFieldNumber(this,pDVar7,local_4b0);
      addField(&groupDD,field_00);
      (*local_4b0->_vptr_DOMNode[4])(&local_4a8);
      plVar2 = local_4a8;
      required._M_dataplus._M_p = (pointer)&required.field_2;
      required._M_string_length = 0;
      required.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>(local_430,"required",&local_4b1);
      cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,local_430,&required);
      if (cVar4 == '\0') {
LAB_00172ecb:
        std::__cxx11::string::~string(local_430);
      }
      else {
        bVar5 = std::operator==(&required,"Y");
        if (!bVar5) {
          bVar5 = std::operator==(&required,"y");
          if (!bVar5) goto LAB_00172ecb;
        }
        std::__cxx11::string::~string(local_430);
        if ((char)local_494 != '\0') {
          addRequiredField(&groupDD,local_4a0,field_00);
        }
      }
LAB_00173050:
      std::__cxx11::string::~string((string *)&required);
      if (local_4a8 != (long *)0x0) {
        (**(code **)(*local_4a8 + 8))();
      }
    }
    else {
      (*local_4b0->_vptr_DOMNode[5])(&required);
      bVar5 = std::operator==(&required,"component");
      std::__cxx11::string::~string((string *)&required);
      if (bVar5) {
        field_00 = addXMLComponentFields(this,pDoc,local_4b0,local_4a0,&groupDD,false);
      }
      else {
        (*local_4b0->_vptr_DOMNode[5])(&required);
        pDVar7 = (DOMDocument *)0x1c59f1;
        bVar5 = std::operator==(&required,"group");
        std::__cxx11::string::~string((string *)&required);
        if (bVar5) {
          field_00 = lookupXMLFieldNumber(this,pDVar7,local_4b0);
          addField(&groupDD,field_00);
          (*local_4b0->_vptr_DOMNode[4])(&local_4a8);
          plVar2 = local_4a8;
          required._M_dataplus._M_p = (pointer)&required.field_2;
          required._M_string_length = 0;
          required.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>(local_430,"required",&local_4b1);
          cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,local_430,&required);
          if (cVar4 == '\0') {
LAB_00172fc3:
            std::__cxx11::string::~string(local_430);
          }
          else {
            bVar5 = std::operator==(&required,"Y");
            if (!bVar5) {
              bVar5 = std::operator==(&required,"y");
              if (!bVar5) goto LAB_00172fc3;
            }
            std::__cxx11::string::~string(local_430);
            if ((char)local_494 != '\0') {
              addRequiredField(&groupDD,local_4a0,field_00);
            }
          }
          plVar2 = local_4a8;
          std::__cxx11::string::string<std::allocator<char>>(local_430,"required",&local_4b1);
          cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,local_430,&required);
          std::__cxx11::string::~string(local_430);
          if (cVar4 == '\0') {
            bVar5 = false;
          }
          else {
            bVar6 = std::operator==(&required,"Y");
            bVar5 = true;
            if (!bVar6) {
              bVar5 = std::operator==(&required,"y");
            }
          }
          addXMLGroup(this,pDoc,local_4b0,local_4a0,&groupDD,bVar5);
          goto LAB_00173050;
        }
      }
    }
    if (delim == 0) {
      delim = field_00;
    }
    (*local_4b0->_vptr_DOMNode[3])(&required);
    _Var3 = required._M_dataplus;
    pDVar1 = local_4b0;
    local_4b0 = (DOMNode *)required._M_dataplus._M_p;
    required._M_dataplus._M_p = (pointer)0x0;
    if (pDVar1 != (DOMNode *)0x0) {
      (*pDVar1->_vptr_DOMNode[1])();
      if (required._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)required._M_dataplus._M_p + 8))();
      }
    }
  } while( true );
}

Assistant:

void DataDictionary::addXMLGroup(
    DOMDocument *pDoc,
    DOMNode *pNode,
    const std::string &msgtype,
    DataDictionary &DD,
    bool groupRequired) {
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to group");
  }
  int group = lookupXMLFieldNumber(pDoc, name);
  int delim = 0;
  int field = 0;
  DataDictionary groupDD;
  DOMNodePtr node = pNode->getFirstChildNode();
  while (node.get()) {
    if (node->getName() == "field") {
      field = lookupXMLFieldNumber(pDoc, node.get());
      groupDD.addField(field);

      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && groupRequired) {
        groupDD.addRequiredField(msgtype, field);
      }
    } else if (node->getName() == "component") {
      field = addXMLComponentFields(pDoc, node.get(), msgtype, groupDD, false);
    } else if (node->getName() == "group") {
      field = lookupXMLFieldNumber(pDoc, node.get());
      groupDD.addField(field);
      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && groupRequired) {
        groupDD.addRequiredField(msgtype, field);
      }
      bool isRequired = false;
      if (attrs->get("required", required)) {
        isRequired = (required == "Y" || required == "y");
      }
      addXMLGroup(pDoc, node.get(), msgtype, groupDD, isRequired);
    }
    if (delim == 0) {
      delim = field;
    }
    RESET_AUTO_PTR(node, node->getNextSiblingNode());
  }

  if (delim) {
    DD.addGroup(msgtype, group, delim, groupDD);
  }
}